

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveExplorer.h
# Opt level: O3

void __thiscall
chrono::ChArchiveExplorer::out_ref
          (ChArchiveExplorer *this,ChValue *bVal,bool already_inserted,size_t obj_ID,size_t ext_ID)

{
  pointer *pppCVar1;
  uint *puVar2;
  _Bit_iterator *p_Var3;
  uint uVar4;
  pointer pbVar5;
  iterator __position;
  size_type sVar6;
  char *pcVar7;
  bool bVar8;
  int iVar9;
  undefined4 extraout_var;
  ulong uVar10;
  undefined4 extraout_var_00;
  int iVar11;
  string username;
  string local_38;
  
  if ((this->found != true) || (this->find_all == true)) {
    pbVar5 = (this->search_tokens).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(long)this->tablevel <
        (ulong)((long)(this->search_tokens).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5)) {
      bVar8 = MatchName(this,pbVar5 + this->tablevel,(bVal->_name)._M_dataplus._M_p);
      iVar9 = this->tablevel;
      if (iVar9 != 0 && !bVar8) {
        uVar10 = (ulong)iVar9;
        iVar11 = iVar9 + 0x3f;
        if (-1 < iVar9) {
          iVar11 = iVar9;
        }
        if (((this->in_array).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
             [(long)(iVar11 >> 6) +
              (ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
             (uVar10 & 0x3f) & 1) == 0) {
          return;
        }
        if (this->use_user_names != true) {
          return;
        }
        pbVar5 = (this->search_tokens).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        sVar6 = pbVar5[uVar10]._M_string_length;
        if (sVar6 == 0) {
          return;
        }
        pcVar7 = pbVar5[uVar10]._M_dataplus._M_p;
        if (*pcVar7 != '\'') {
          return;
        }
        if (pcVar7[sVar6 - 1] != '\'') {
          return;
        }
        iVar9 = (*bVal->_vptr_ChValue[0xf])(bVal);
        if ((char)iVar9 == '\0') {
          return;
        }
        std::__cxx11::string::substr
                  ((ulong)&local_38,
                   (ulong)((this->search_tokens).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + this->tablevel));
        iVar9 = (*bVal->_vptr_ChValue[0x10])(bVal);
        bVar8 = MatchName(this,&local_38,*(char **)CONCAT44(extraout_var_00,iVar9));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
        if (!bVar8) {
          return;
        }
        iVar9 = this->tablevel;
      }
      this->found_obj = true;
      if ((long)(this->search_tokens).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->search_tokens).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5 == (long)(iVar9 + 1)) {
        iVar9 = (*bVal->_vptr_ChValue[2])(bVal);
        local_38._M_dataplus._M_p = (pointer)CONCAT44(extraout_var,iVar9);
        __position._M_current =
             (this->results).
             super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->results).
            super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<chrono::ChValue*,std::allocator<chrono::ChValue*>>::
          _M_realloc_insert<chrono::ChValue*>
                    ((vector<chrono::ChValue*,std::allocator<chrono::ChValue*>> *)&this->results,
                     __position,(ChValue **)&local_38);
        }
        else {
          *__position._M_current = (ChValue *)local_38._M_dataplus._M_p;
          pppCVar1 = &(this->results).
                      super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppCVar1 = *pppCVar1 + 1;
        }
        this->found = true;
      }
      else {
        this->tablevel = iVar9 + 1;
        std::vector<bool,_std::allocator<bool>_>::push_back(&this->in_array,false);
        (*bVal->_vptr_ChValue[0xd])(bVal,this);
        this->tablevel = this->tablevel + -1;
        puVar2 = &(this->in_array).super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
        uVar4 = *puVar2;
        *puVar2 = *puVar2 - 1;
        if (uVar4 == 0) {
          (this->in_array).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0x3f;
          p_Var3 = &(this->in_array).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish;
          (p_Var3->super__Bit_iterator_base)._M_p = (p_Var3->super__Bit_iterator_base)._M_p + -1;
        }
      }
    }
  }
  return;
}

Assistant:

virtual void out_ref          (ChValue& bVal,  bool already_inserted, size_t obj_ID, size_t ext_ID) 
      {
          if (this->found && !this->find_all) return;
          if (this->tablevel >= this->search_tokens.size()) return;

          bool matched = this->MatchName(search_tokens[this->tablevel],bVal.name()) || (tablevel==0);
          if (      ! matched 
                    && tablevel
                    && this->in_array[tablevel] 
                    && this->use_user_names 
                    && !search_tokens[this->tablevel].empty()
                    && (search_tokens[this->tablevel].front()==*"'" && search_tokens[this->tablevel].back()==*"'")
                    && bVal.HasArchiveContainerName() ) {
              std::string username = search_tokens[this->tablevel].substr(1,search_tokens[this->tablevel].length()-2);
              matched = this->MatchName(username,bVal.CallArchiveContainerName().c_str());
          }

          if (matched) {
                this->found_obj = true;
                if (this->tablevel +1 == this->search_tokens.size()) {
                    this->results.push_back(bVal.new_clone());
                    this->found = true;
                } else {
                    ++tablevel;
                    in_array.push_back(false);
                    bVal.CallArchiveOut(*this);
                    --tablevel;
                    in_array.pop_back();
                }
          }
      }